

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseRow(TidyDocImpl *doc,Node *row,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  long lVar2;
  Bool BVar3;
  TidyTagId TVar4;
  Node *node;
  Dict *pDVar5;
  uint code;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *node_00;
  TidyTagId tid;
  TidyDocImpl *local_68;
  TidyParserMemory memory;
  
  pLVar1 = doc->lexer;
  if (row == (Node *)0x0) {
    prvTidypopMemory(doc);
    local_68 = (TidyDocImpl *)memory.original_node;
  }
  else {
    memory.register_1 = no;
    if ((row->tag->model & 1) != 0) {
LAB_0013b564:
      return (Node *)0x0;
    }
    memory.reentry_state = 0;
    local_68 = (TidyDocImpl *)row;
  }
  do {
    switch(memory.reentry_state) {
    case 0:
      node = prvTidyGetToken(doc,IgnoreWhitespace);
      memory.reentry_state = 3;
      if (node != (Node *)0x0) {
        if (node->tag == (local_68->root).tag) {
          if (node->type == EndTag) {
            prvTidyFreeNode(doc,node);
            (local_68->root).closed = yes;
          }
          else {
            prvTidyUngetToken(doc);
          }
          FixEmptyRow(doc,&local_68->root);
          return (Node *)0x0;
        }
        if (node->type == EndTag) {
          BVar3 = prvTidynodeHasCM(node,0x82);
          pDVar5 = node->tag;
          if (BVar3 == no) {
            if (pDVar5 == (Dict *)0x0) goto LAB_0013b328;
            TVar4 = pDVar5->id;
            tid = TidyTag_TABLE;
            if (TVar4 == TidyTag_TABLE) goto LAB_0013b309;
LAB_0013b323:
            if (TVar4 != TidyTag_FORM) goto LAB_0013b328;
LAB_0013b341:
            if (pDVar5->id == TidyTag_FORM) {
              *(byte *)&doc->badForm = (byte)doc->badForm | 1;
            }
          }
          else {
            if (pDVar5 == (Dict *)0x0) {
              pDVar5 = (Dict *)0x0;
              tid = TidyTag_UNKNOWN;
            }
            else {
              tid = pDVar5->id;
            }
LAB_0013b309:
            BVar3 = DescendantOf(&local_68->root,tid);
            if (BVar3 != no) goto LAB_0013b559;
            if (pDVar5 != (Dict *)0x0) {
              TVar4 = pDVar5->id;
              goto LAB_0013b323;
            }
LAB_0013b328:
            BVar3 = prvTidynodeHasCM(node,0x18);
            pDVar5 = node->tag;
            if (BVar3 == no) {
              if ((pDVar5 == (Dict *)0x0) ||
                 ((pDVar5->id != TidyTag_TH && (pDVar5->id != TidyTag_TD)))) goto LAB_0013b372;
            }
            else if (pDVar5 != (Dict *)0x0) goto LAB_0013b341;
          }
LAB_0013b3c9:
          code = 0x235;
        }
        else {
LAB_0013b372:
          BVar3 = InsertMisc(&local_68->root,node);
          memory.reentry_state = 0;
          if (BVar3 != no) break;
          if (node->tag == (Dict *)0x0) {
            if (node->type == TextNode) goto LAB_0013b3a1;
            goto LAB_0013b3c9;
          }
          if (node->tag->id == TidyTag_TABLE) goto LAB_0013b3c9;
LAB_0013b3a1:
          BVar3 = prvTidynodeHasCM(node,0x100);
          if (BVar3 != no) {
LAB_0013b559:
            prvTidyUngetToken(doc);
            return (Node *)0x0;
          }
          if (node->type == EndTag) goto LAB_0013b3c9;
          if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FORM)) {
            BVar3 = prvTidynodeIsText(node);
            node_00 = extraout_RDX;
            if ((BVar3 != no) ||
               (BVar3 = prvTidynodeHasCM(node,0x18), node_00 = extraout_RDX_00, BVar3 != no)) {
              MoveBeforeTable(local_68,node,node_00);
              prvTidyReport(doc,&local_68->root,node,0x27e);
              memory.register_1 = pLVar1->excludeBlocks;
              pLVar1->excludeBlocks = no;
              pLVar1->exiled = yes;
              if (node->type != TextNode) {
                lVar2 = 1;
                goto LAB_0013b5f5;
              }
              pLVar1->exiled = no;
              pLVar1->excludeBlocks = memory.register_1;
              memory.reentry_state = 0;
              break;
            }
            pDVar5 = node->tag;
            if ((pDVar5->model & 4) != 0) {
              memory.reentry_state = 0;
              prvTidyReport(doc,&local_68->root,node,0x27e);
              MoveToHead(doc,&local_68->root,node);
              break;
            }
LAB_0013b4cb:
            if ((pDVar5->id == TidyTag_TD) || (pDVar5->id == TidyTag_TH)) {
              prvTidyInsertNodeAtEnd(&local_68->root,node);
              memory.register_1 = pLVar1->excludeBlocks;
              pLVar1->excludeBlocks = no;
              lVar2 = 2;
LAB_0013b5f5:
              memory._32_8_ = (ulong)(uint)memory.register_1 << 0x20;
              memory._24_8_ = lVar2 << 0x20;
              data.original_node = &local_68->root;
              data.identity = prvTidyParseRow;
              data.reentry_node = node;
              data.reentry_mode = memory.reentry_mode;
              data.reentry_state = memory.reentry_state;
              data.mode = memory.mode;
              data.register_1 = memory.register_1;
              data._40_8_ = 0;
              prvTidypushMemory(doc,data);
              return node;
            }
          }
          else {
            prvTidyUngetToken(doc);
            node = prvTidyInferredTag(doc,TidyTag_TD);
            prvTidyReport(doc,&local_68->root,node,0x261);
            if (node == (Node *)0x0) {
              node = (Node *)0x0;
            }
            else {
              pDVar5 = node->tag;
              if (pDVar5 != (Dict *)0x0) goto LAB_0013b4cb;
            }
          }
          code = 0x27e;
        }
        prvTidyReport(doc,&local_68->root,node,code);
        prvTidyFreeNode(doc,node);
        memory.reentry_state = 0;
      }
      break;
    case 1:
      pLVar1->exiled = no;
      pLVar1->excludeBlocks = memory.register_1;
      memory.reentry_state = 0;
      break;
    case 2:
      pLVar1->excludeBlocks = memory.register_1;
      while (memory.reentry_state = 0, pLVar1->istackbase < pLVar1->istacksize) {
        prvTidyPopInline(doc,(Node *)0x0);
      }
      break;
    case 3:
      goto LAB_0013b564;
    }
  } while( true );
}

Assistant:

Node* TY_(ParseRow)( TidyDocImpl* doc, Node *row, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool exclude_state = no;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NOT_ENDTAG,        /* To-do after re-entering after !EndTag checks. */
        STATE_POST_TD_TH,             /* To-do after re-entering after TD/TH checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( row == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        row = memory.original_node;
        state = memory.reentry_state;
        exclude_state = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(row);

        if (row->tag->model & CM_EMPTY)
            return NULL;
    }

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
        {
            node = TY_(GetToken)( doc, IgnoreWhitespace );
            DEBUG_LOG_GOT_TOKEN(node);
        }
    
        switch (state)
        {
            case STATE_INITIAL:
            {
                if ( node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if (node->tag == row->tag)
                {
                    if (node->type == EndTag)
                    {
                        TY_(FreeNode)( doc, node);
                        row->closed = yes;
                        FixEmptyRow( doc, row);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /* New row start implies end of current row */
                    TY_(UngetToken)( doc );
                    FixEmptyRow( doc, row);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                if ( node->type == EndTag )
                {
                    if ( (TY_(nodeHasCM)(node, CM_HTML|CM_TABLE) || nodeIsTABLE(node))
                         && DescendantOf(row, TagId(node)) )
                    {
                        TY_(UngetToken)( doc );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        if ( nodeIsFORM(node) )
                            BadForm( doc );

                        TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }
                }

                /* deal with comments etc. */
                if (InsertMisc(row, node))
                    continue;

                /* discard unknown tags */
                if (node->tag == NULL && node->type != TextNode)
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* discard unexpected <table> element */
                if ( nodeIsTABLE(node) )
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* THEAD, TFOOT or TBODY */
                if ( TY_(nodeHasCM)(node, CM_ROWGRP) )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if text or inline or block move before table
                  if head content move to head
                */

                if (node->type != EndTag)
                {
                    if ( nodeIsFORM(node) )
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_TD);
                        TY_(Report)(doc, row, node, MISSING_STARTTAG);
                    }
                    else if ( TY_(nodeIsText)(node)
                              || TY_(nodeHasCM)(node, CM_BLOCK | CM_INLINE) )
                    {
                        MoveBeforeTable( doc, row, node );
                        TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                        lexer->exiled = yes;
                        exclude_state = lexer->excludeBlocks;
                        lexer->excludeBlocks = no;

                        if (node->type != TextNode)
                        {
                            TidyParserMemory memory = {0};
                            memory.identity = TY_(ParseRow);
                            memory.original_node = row;
                            memory.reentry_node = node;
                            memory.reentry_state = STATE_POST_NOT_ENDTAG;
                            memory.register_1 = exclude_state;
                            TY_(pushMemory)( doc, memory );
                            DEBUG_LOG_EXIT_WITH_NODE(node);
                            return node;
                        }
                        
                        lexer->exiled = no;
                        lexer->excludeBlocks = exclude_state;
                        continue;
                    }
                    else if (node->tag->model & CM_HEAD)
                    {
                        TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                        MoveToHead( doc, row, node);
                        continue;
                    }
                }

                if ( !(nodeIsTD(node) || nodeIsTH(node)) )
                {
                    TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* node should be <TD> or <TH> */
                TY_(InsertNodeAtEnd)(row, node);
                exclude_state = lexer->excludeBlocks;
                lexer->excludeBlocks = no;
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseRow);
                    memory.original_node = row;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_POST_TD_TH;
                    memory.register_1 = exclude_state;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }
            } break;
                
                
            case STATE_POST_NOT_ENDTAG:
            {
                lexer->exiled = no;
                lexer->excludeBlocks = exclude_state; /* capture this in stack. */
                state = STATE_INITIAL;
                continue;
            } break;
                
                
            case STATE_POST_TD_TH:
            {
                lexer->excludeBlocks = exclude_state; /* capture this in stack. */

                /* pop inline stack */
                while ( lexer->istacksize > lexer->istackbase )
                    TY_(PopInline)( doc, NULL );
                
                state = STATE_INITIAL;
                continue;
            } break;
                
                
            default:
                break;
                
        } /* switch */
    } /* while */
    DEBUG_LOG_EXIT;
    return NULL;
}